

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

void qtree_expand(uchar *infile,uchar *a,int nx,int ny,uchar *b)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uchar *puVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  
  if (0 < nx) {
    iVar6 = (ny - (ny + 1 >> 0x1f)) + 1 >> 1;
    uVar12 = nx + 1U >> 1;
    iVar14 = iVar6 * uVar12 + -1;
    iVar9 = iVar6 * 2 + (uVar12 - 1) * ny * 2 + -2;
    do {
      if (0 < ny) {
        puVar10 = a + iVar14;
        iVar11 = iVar6 + 1;
        iVar13 = iVar9;
        do {
          b[iVar13] = *puVar10;
          iVar14 = iVar14 + -1;
          puVar10 = puVar10 + -1;
          iVar13 = iVar13 + -2;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
      }
      iVar9 = iVar9 + ny * -2;
      bVar5 = 1 < (int)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar5);
  }
  iVar6 = 0;
  if (1 < nx) {
    iVar14 = 0;
    iVar6 = 0;
    iVar9 = ny;
    do {
      if (ny < 2) {
        iVar13 = iVar6 * ny;
        uVar12 = 0;
      }
      else {
        lVar7 = 0;
        do {
          uVar8 = (ulong)b[lVar7 + iVar14];
          if (uVar8 < 0x10) {
            uVar1 = (&DAT_001d849e)[uVar8];
            uVar2 = (&DAT_001d84ae)[uVar8];
            uVar3 = (&DAT_001d84be)[uVar8];
            b[lVar7 + (long)iVar9 + 1] = (&DAT_001d848e)[uVar8];
            b[lVar7 + iVar9] = uVar1;
            b[lVar7 + (long)iVar14 + 1] = uVar2;
            b[lVar7 + iVar14] = uVar3;
          }
          lVar7 = lVar7 + 2;
        } while ((int)lVar7 < ny + -1);
        iVar13 = (int)lVar7 + iVar14;
        uVar12 = ny & 0xfffffffe;
      }
      if ((int)uVar12 < ny) {
        b[iVar13 + ny] = b[iVar13] >> 1 & 1;
        b[iVar13] = b[iVar13] >> 3 & 1;
      }
      iVar6 = iVar6 + 2;
      iVar9 = iVar9 + ny * 2;
      iVar14 = iVar14 + ny * 2;
    } while (iVar6 < nx + -1);
  }
  if (iVar6 < nx) {
    iVar6 = iVar6 * ny;
    uVar12 = 0;
    if (1 < ny) {
      lVar7 = 0;
      do {
        bVar4 = b[lVar7 + iVar6];
        b[lVar7 + (long)iVar6 + 1] = bVar4 >> 2 & 1;
        b[lVar7 + iVar6] = bVar4 >> 3 & 1;
        lVar7 = lVar7 + 2;
      } while ((int)lVar7 < ny + -1);
      uVar12 = ny & 0x7ffffffe;
      iVar6 = iVar6 + (int)lVar7;
    }
    if ((int)uVar12 < ny) {
      b[iVar6] = b[iVar6] >> 3 & 1;
    }
  }
  if (0 < ny * nx) {
    lVar7 = (ulong)(uint)(ny * nx) + 1;
    do {
      if (b[lVar7 + -2] != '\0') {
        iVar6 = input_huffman(infile);
        b[lVar7 + -2] = (uchar)iVar6;
      }
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  return;
}

Assistant:

static void
qtree_expand(unsigned char *infile, unsigned char a[], int nx, int ny, unsigned char b[])
{
int i;

	/*
	 * first copy a to b, expanding each 4-bit value
	 */
	qtree_copy(a,nx,ny,b,ny);
	/*
	 * now read new 4-bit values into b for each non-zero element
	 */
	for (i = nx*ny-1; i >= 0; i--) {
		if (b[i]) b[i] = input_huffman(infile);
	}
}